

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embedded_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::EmbeddedGeometryInterface::computeFaceNormals
          (EmbeddedGeometryInterface *this)

{
  Vector3 *pVVar1;
  unsigned_long uVar2;
  pointer puVar3;
  pointer puVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  Vector3 *pVVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  unsigned_long uVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_98;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_80;
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3> local_68;
  
  DependentQuantity::ensureHave(&(this->vertexPositionsQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::MeshData
            (&local_68,
             (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
             super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::operator=
            (&this->faceNormals,&local_68);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::~MeshData(&local_68);
  local_68.mesh =
       (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
       super_BaseGeometryInterface.mesh;
  local_68.defaultValue.y = (double)(local_68.mesh)->nFacesFillCount;
  local_68.defaultValue.x = 0.0;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            (&local_98,(RangeSetBase<geometrycentral::surface::FaceRangeF> *)&local_68);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            (&local_80,(RangeSetBase<geometrycentral::surface::FaceRangeF> *)&local_68);
  do {
    if (local_98.iCurr == local_80.iCurr) {
      return;
    }
    pVVar1 = (this->vertexPositions).data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    auVar17 = ZEXT864(0) << 0x40;
    auVar19 = ZEXT864(0) << 0x40;
    bVar14 = true;
    uVar2 = ((local_98.mesh)->fHalfedgeArr).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_98.iCurr];
    uVar13 = uVar2;
    do {
      auVar16 = auVar17._0_16_;
      auVar18 = auVar19._0_16_;
      if ((!bVar14) && (uVar13 == uVar2)) break;
      puVar3 = ((local_98.mesh)->heNextArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = ((local_98.mesh)->heVertexArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = puVar3[uVar13];
      uVar6 = puVar4[uVar13];
      auVar12._0_8_ = pVVar1[uVar6].y;
      auVar12._8_8_ = pVVar1[uVar6].z;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = pVVar1[uVar6].x;
      auVar28._8_8_ = pVVar1[uVar6].z;
      auVar28._0_8_ = pVVar1[uVar6].z;
      uVar7 = puVar4[puVar3[uVar5]];
      auVar11._0_8_ = pVVar1[puVar4[uVar5]].y;
      auVar11._8_8_ = pVVar1[puVar4[uVar5]].z;
      auVar18 = vsubpd_avx(auVar11,auVar12);
      auVar11 = vunpcklpd_avx(auVar28,auVar21);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = pVVar1[uVar7].z;
      auVar16 = vmovhpd_avx(auVar26,pVVar1[uVar7].x);
      bVar14 = false;
      auVar11 = vsubpd_avx(auVar16,auVar11);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = pVVar1[puVar4[uVar5]].x - pVVar1[uVar6].x;
      auVar16 = vshufpd_avx(auVar18,auVar24,1);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = pVVar1[uVar7].y - (double)auVar12._0_8_;
      auVar12 = vunpcklpd_avx(auVar25,auVar11);
      auVar27._0_8_ = auVar12._0_8_ * auVar16._0_8_;
      auVar27._8_8_ = auVar12._8_8_ * auVar16._8_8_;
      auVar12 = vfmsub231pd_fma(auVar27,auVar18,auVar11);
      auVar16 = vshufpd_avx(auVar11,auVar11,1);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = auVar16._0_8_ * auVar18._0_8_;
      auVar18 = vfmsub231sd_fma(auVar22,auVar24,auVar25);
      auVar16._0_8_ = auVar17._0_8_ + auVar12._0_8_;
      auVar16._8_8_ = auVar17._8_8_ + auVar12._8_8_;
      auVar17 = ZEXT1664(auVar16);
      dVar9 = auVar19._0_8_ + auVar18._0_8_;
      auVar19 = ZEXT864((ulong)dVar9);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar9;
      bVar15 = puVar3[puVar3[uVar5]] != uVar13;
      uVar13 = uVar5;
    } while (bVar15);
    dVar9 = auVar16._0_8_;
    auVar23._0_8_ = dVar9 * dVar9;
    dVar10 = auVar16._8_8_;
    auVar23._8_8_ = dVar10 * dVar10;
    pVVar8 = (this->faceNormals).data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    auVar12 = vshufpd_avx(auVar23,auVar23,1);
    auVar16 = vfmadd231sd_fma(auVar12,auVar16,auVar16);
    auVar16 = vfmadd231sd_fma(auVar16,auVar18,auVar18);
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    dVar20 = 1.0 / auVar16._0_8_;
    pVVar1 = pVVar8 + local_98.iCurr;
    pVVar1->x = dVar9 * dVar20;
    pVVar1->y = dVar10 * dVar20;
    pVVar8[local_98.iCurr].z = auVar18._0_8_ * dVar20;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++(&local_98);
  } while( true );
}

Assistant:

void EmbeddedGeometryInterface::computeFaceNormals() {
  vertexPositionsQ.ensureHave();

  faceNormals = FaceData<Vector3>(mesh);

  for (Face f : mesh.faces()) {

    // For general polygons, take the sum of the cross products at each corner
    Vector3 normalSum = Vector3::zero();
    for (Halfedge heF : f.adjacentHalfedges()) {

      // Gather vertex positions for next three vertices
      Halfedge he = heF;
      Vector3 pA = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pB = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pC = vertexPositions[he.vertex()];

      normalSum += cross(pB - pA, pC - pA);

      // In the special case of a triangle, there is no need to to repeat at all three corners; the result will be the
      // same
      if (he.next() == heF) break;
    }

    Vector3 normal = unit(normalSum);
    faceNormals[f] = normal;
  }
}